

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O1

void __thiscall deqp::egl::ResizeTest::resize(ResizeTest *this,IVec2 *size)

{
  ostringstream *this_00;
  undefined1 local_190 [384];
  
  (*((this->m_nativeWindow).
     super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr)->
    _vptr_NativeWindow[6])();
  (*((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_platform->_vptr_Platform[2])
            ();
  local_190._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Resized surface to size ",0x18);
  tcu::operator<<((ostream *)this_00,size);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  return;
}

Assistant:

void ResizeTest::resize (IVec2 size)
{
	m_nativeWindow->setSurfaceSize(size);
	m_testCtx.getPlatform().processEvents();
	m_log << TestLog::Message
		  << "Resized surface to size " << size
		  << TestLog::EndMessage;
}